

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowLabelTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if ((iVar1 == 0) && (iVar1 = Aig_ObjIsConst1(pObj), iVar1 == 0)) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x265,"void Llb_ManFlowLabelTfi_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      Llb_ManFlowLabelTfi_rec(p,pAVar2);
      pAVar2 = Aig_ObjFanin1(pObj);
      Llb_ManFlowLabelTfi_rec(p,pAVar2);
    }
  }
  return;
}

Assistant:

void Llb_ManFlowLabelTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin1(pObj) );
}